

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O0

Handle __thiscall soul::Value::getStringLiteral(Value *this)

{
  Handle HVar1;
  PackedData local_30;
  Value *local_18;
  Value *this_local;
  
  local_18 = this;
  getData(&local_30,this);
  HVar1 = PackedData::getAs<choc::value::StringDictionary::Handle>(&local_30);
  return (Handle)HVar1.handle;
}

Assistant:

StringDictionary::Handle Value::getStringLiteral() const    { return getData().getAs<StringDictionary::Handle>(); }